

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmSat.c
# Opt level: O1

int Sfm_NtkWindowToSolver(Sfm_Ntk_t *p)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int *piVar5;
  int *piVar6;
  lit *plVar7;
  int *piVar8;
  int iVar9;
  int iVar10;
  Vec_Int_t *pVVar11;
  Vec_Wec_t *pVVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  timespec ts;
  timespec local_68;
  sat_solver *local_58;
  int local_4c;
  int local_48;
  int local_44;
  long local_40;
  long local_38;
  
  iVar9 = clock_gettime(3,&local_68);
  if (iVar9 < 0) {
    local_40 = 1;
  }
  else {
    lVar14 = SUB168(SEXT816(-0x20c49ba5e353f7cf) *
                    SEXT816(CONCAT44(local_68.tv_nsec._4_4_,(int)local_68.tv_nsec)),8);
    local_40 = ((lVar14 >> 7) - (lVar14 >> 0x3f)) +
               CONCAT44(local_68.tv_sec._4_4_,(int)local_68.tv_sec) * -1000000;
  }
  sat_solver_restart(p->pSat);
  sat_solver_setnvars(p->pSat,p->vRoots->nSize + p->vOrder->nSize + p->vTfo->nSize + 0xb);
  if (1 < p->nSatVars) {
    lVar14 = 1;
    do {
      if ((p->vVar2Id).nSize <= lVar14) goto LAB_00531ddf;
      piVar5 = (p->vVar2Id).pArray;
      uVar1 = piVar5[lVar14];
      uVar15 = (ulong)uVar1;
      if (uVar15 != 0xffffffff) {
        if (((int)uVar1 < 0) || ((p->vId2Var).nSize <= (int)uVar1)) goto LAB_00531ddf;
        piVar6 = (p->vId2Var).pArray;
        if (piVar6[uVar15] < 1) goto LAB_00531e7a;
        piVar6[uVar15] = -1;
        if ((p->vVar2Id).nSize <= lVar14) goto LAB_00531e3c;
        piVar5[lVar14] = -1;
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < p->nSatVars);
  }
  p->nSatVars = 1;
  pVVar11 = p->vOrder;
  if (0 < pVVar11->nSize) {
    piVar5 = pVVar11->pArray;
    lVar14 = 0;
    do {
      iVar9 = piVar5[lVar14];
      lVar16 = (long)iVar9;
      uVar1 = p->nSatVars;
      p->nSatVars = uVar1 + 1;
      if ((lVar16 < 0) || ((p->vId2Var).nSize <= iVar9)) goto LAB_00531ddf;
      piVar6 = (p->vId2Var).pArray;
      if (piVar6[lVar16] != -1) goto LAB_00531e5b;
      piVar6[lVar16] = uVar1;
      if (((int)uVar1 < 0) || ((p->vVar2Id).nSize <= (int)uVar1)) goto LAB_00531e3c;
      (p->vVar2Id).pArray[uVar1] = iVar9;
      lVar14 = lVar14 + 1;
    } while (lVar14 < pVVar11->nSize);
  }
  p->vDivVars->nSize = 0;
  pVVar11 = p->vDivs;
  if (0 < pVVar11->nSize) {
    lVar14 = 0;
    do {
      iVar9 = pVVar11->pArray[lVar14];
      if (((long)iVar9 < 0) || ((p->vId2Var).nSize <= iVar9)) goto LAB_00531ddf;
      iVar9 = (p->vId2Var).pArray[iVar9];
      if (iVar9 < 1) goto LAB_00531e1d;
      Vec_IntPush(p->vDivVars,iVar9);
      lVar14 = lVar14 + 1;
      pVVar11 = p->vDivs;
    } while (lVar14 < pVVar11->nSize);
  }
  pVVar11 = p->vOrder;
  if (0 < pVVar11->nSize) {
    lVar14 = 0;
    do {
      uVar1 = pVVar11->pArray[lVar14];
      if (p->nPis <= (int)uVar1) {
        p->vFaninMap->nSize = 0;
        if ((int)uVar1 < 0) goto LAB_00531dfe;
        lVar16 = 0;
        while( true ) {
          if ((p->vFanins).nSize <= (int)uVar1) goto LAB_00531dfe;
          pVVar11 = (p->vFanins).pArray;
          if (pVVar11[uVar1].nSize <= lVar16) break;
          if (pVVar11[uVar1].nSize <= lVar16) goto LAB_00531ddf;
          iVar9 = pVVar11[uVar1].pArray[lVar16];
          if (((long)iVar9 < 0) || ((p->vId2Var).nSize <= iVar9)) goto LAB_00531ddf;
          iVar9 = (p->vId2Var).pArray[iVar9];
          if (iVar9 < 1) goto LAB_00531e1d;
          Vec_IntPush(p->vFaninMap,iVar9);
          lVar16 = lVar16 + 1;
          if ((int)uVar1 < 0) goto LAB_00531dfe;
        }
        if ((p->vId2Var).nSize <= (int)uVar1) goto LAB_00531ddf;
        iVar9 = (p->vId2Var).pArray[uVar1];
        if (iVar9 < 1) goto LAB_00531e1d;
        Vec_IntPush(p->vFaninMap,iVar9);
        if (p->vCnfs->nSize <= (int)uVar1) goto LAB_00531dfe;
        Sfm_TranslateCnf(p->vClauses,(Vec_Str_t *)(p->vCnfs->pArray + uVar1),p->vFaninMap,-1);
        pVVar12 = p->vClauses;
        if (0 < pVVar12->nSize) {
          lVar16 = 8;
          lVar17 = 0;
          do {
            lVar13 = (long)*(int *)((long)pVVar12->pArray + lVar16 + -4);
            if (lVar13 == 0) break;
            plVar7 = *(lit **)((long)&pVVar12->pArray->nCap + lVar16);
            iVar9 = sat_solver_addclause(p->pSat,plVar7,plVar7 + lVar13);
            if (iVar9 == 0) {
              return 0;
            }
            lVar17 = lVar17 + 1;
            pVVar12 = p->vClauses;
            lVar16 = lVar16 + 0x10;
          } while (lVar17 < pVVar12->nSize);
        }
      }
      lVar14 = lVar14 + 1;
      pVVar11 = p->vOrder;
    } while (lVar14 < pVVar11->nSize);
  }
  if (0 < p->vTfo->nSize) {
    if (p->pPars->nTfoLevMax < 1) {
      __assert_fail("p->pPars->nTfoLevMax > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmSat.c"
                    ,100,"int Sfm_NtkWindowToSolver(Sfm_Ntk_t *)");
    }
    if (p->vRoots->nSize < 1) {
      __assert_fail("Vec_IntSize(p->vRoots) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmSat.c"
                    ,0x65,"int Sfm_NtkWindowToSolver(Sfm_Ntk_t *)");
    }
    if (*p->vTfo->pArray == p->iPivotNode) {
      __assert_fail("Vec_IntEntry(p->vTfo, 0) != p->iPivotNode",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmSat.c"
                    ,0x66,"int Sfm_NtkWindowToSolver(Sfm_Ntk_t *)");
    }
    p->vLits->nSize = 0;
    pVVar11 = p->vRoots;
    if (0 < pVVar11->nSize) {
      lVar14 = 0;
      do {
        iVar9 = pVVar11->pArray[lVar14];
        if (((long)iVar9 < 0) || ((p->vId2Var).nSize <= iVar9)) goto LAB_00531ddf;
        iVar9 = (p->vId2Var).pArray[iVar9];
        if (iVar9 < 1) goto LAB_00531e1d;
        Vec_IntPush(p->vLits,iVar9);
        lVar14 = lVar14 + 1;
        pVVar11 = p->vRoots;
      } while (lVar14 < pVVar11->nSize);
    }
    pVVar11 = p->vTfo;
    if (0 < pVVar11->nSize) {
      piVar5 = pVVar11->pArray;
      lVar14 = 0;
      do {
        iVar9 = piVar5[lVar14];
        lVar16 = (long)iVar9;
        if ((lVar16 < 0) || (iVar10 = (p->vId2Var).nSize, iVar10 <= iVar9)) goto LAB_00531ddf;
        piVar6 = (p->vId2Var).pArray;
        iVar2 = piVar6[lVar16];
        lVar17 = (long)iVar2;
        if (lVar17 < 1) goto LAB_00531e1d;
        if ((p->vVar2Id).nSize <= iVar2) goto LAB_00531ddf;
        piVar8 = (p->vVar2Id).pArray;
        lVar13 = (long)piVar8[lVar17];
        if ((lVar13 < 0) || (iVar10 <= piVar8[lVar17])) goto LAB_00531ddf;
        if (piVar6[lVar13] < 1) {
LAB_00531e7a:
          __assert_fail("Vec_IntEntry(&p->vId2Var, iObj) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmInt.h"
                        ,0xa9,"void Sfm_ObjCleanSatVar(Sfm_Ntk_t *, int)");
        }
        piVar6[lVar13] = -1;
        if ((p->vVar2Id).nSize <= iVar2) goto LAB_00531e3c;
        piVar8[lVar17] = -1;
        iVar10 = (p->vId2Var).nSize;
        uVar1 = p->nSatVars;
        p->nSatVars = uVar1 + 1;
        if (iVar10 <= iVar9) goto LAB_00531ddf;
        if (piVar6[lVar16] != -1) {
LAB_00531e5b:
          __assert_fail("Vec_IntEntry(&p->vId2Var, iObj) == -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmInt.h"
                        ,0xa8,"void Sfm_ObjSetSatVar(Sfm_Ntk_t *, int, int)");
        }
        piVar6[lVar16] = uVar1;
        if (((int)uVar1 < 0) || ((p->vVar2Id).nSize <= (int)uVar1)) goto LAB_00531e3c;
        piVar8[uVar1] = iVar9;
        lVar14 = lVar14 + 1;
      } while (lVar14 < pVVar11->nSize);
    }
    pVVar11 = p->vTfo;
    if (0 < pVVar11->nSize) {
      lVar14 = 0;
      do {
        uVar1 = pVVar11->pArray[lVar14];
        if (((int)uVar1 < p->nPis) || (p->nObjs <= (int)(p->nPos + uVar1))) {
          __assert_fail("Sfm_ObjIsNode(p, iNode)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmSat.c"
                        ,0x74,"int Sfm_NtkWindowToSolver(Sfm_Ntk_t *)");
        }
        p->vFaninMap->nSize = 0;
        if ((int)uVar1 < 0) {
LAB_00531dfe:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                        ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
        }
        lVar16 = 0;
        while( true ) {
          if ((p->vFanins).nSize <= (int)uVar1) goto LAB_00531dfe;
          pVVar11 = (p->vFanins).pArray;
          if (pVVar11[uVar1].nSize <= lVar16) break;
          if (pVVar11[uVar1].nSize <= lVar16) goto LAB_00531ddf;
          iVar9 = pVVar11[uVar1].pArray[lVar16];
          if (((long)iVar9 < 0) || ((p->vId2Var).nSize <= iVar9)) goto LAB_00531ddf;
          iVar9 = (p->vId2Var).pArray[iVar9];
          if (iVar9 < 1) goto LAB_00531e1d;
          Vec_IntPush(p->vFaninMap,iVar9);
          lVar16 = lVar16 + 1;
          if ((int)uVar1 < 0) goto LAB_00531dfe;
        }
        if ((p->vId2Var).nSize <= (int)uVar1) goto LAB_00531ddf;
        iVar9 = (p->vId2Var).pArray[uVar1];
        if (iVar9 < 1) goto LAB_00531e1d;
        Vec_IntPush(p->vFaninMap,iVar9);
        if (p->vCnfs->nSize <= (int)uVar1) goto LAB_00531dfe;
        iVar9 = p->iPivotNode;
        if (((long)iVar9 < 0) || ((p->vId2Var).nSize <= iVar9)) goto LAB_00531ddf;
        iVar9 = (p->vId2Var).pArray[iVar9];
        if (iVar9 < 1) goto LAB_00531e1d;
        Sfm_TranslateCnf(p->vClauses,(Vec_Str_t *)(p->vCnfs->pArray + uVar1),p->vFaninMap,iVar9);
        pVVar12 = p->vClauses;
        if (0 < pVVar12->nSize) {
          lVar16 = 8;
          lVar17 = 0;
          do {
            lVar13 = (long)*(int *)((long)pVVar12->pArray + lVar16 + -4);
            if (lVar13 == 0) break;
            plVar7 = *(lit **)((long)&pVVar12->pArray->nCap + lVar16);
            iVar9 = sat_solver_addclause(p->pSat,plVar7,plVar7 + lVar13);
            if (iVar9 == 0) {
              return 0;
            }
            lVar17 = lVar17 + 1;
            pVVar12 = p->vClauses;
            lVar16 = lVar16 + 0x10;
          } while (lVar17 < pVVar12->nSize);
        }
        lVar14 = lVar14 + 1;
        pVVar11 = p->vTfo;
      } while (lVar14 < pVVar11->nSize);
    }
    pVVar11 = p->vRoots;
    if (0 < pVVar11->nSize) {
      plVar7 = (lit *)((long)&local_68.tv_nsec + 4);
      lVar14 = 0;
      do {
        if (p->vLits->nSize <= lVar14) {
LAB_00531ddf:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar1 = pVVar11->pArray[lVar14];
        if (((int)uVar1 < 0) || ((p->vId2Var).nSize <= (int)uVar1)) goto LAB_00531ddf;
        uVar1 = (p->vId2Var).pArray[uVar1];
        if ((int)uVar1 < 1) {
LAB_00531e1d:
          __assert_fail("Vec_IntEntry(&p->vId2Var, iObj) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmInt.h"
                        ,0xa7,"int Sfm_ObjSatVar(Sfm_Ntk_t *, int)");
        }
        local_58 = p->pSat;
        uVar3 = p->vLits->pArray[lVar14];
        uVar4 = p->nSatVars;
        p->nSatVars = uVar4 + 1;
        local_38 = lVar14;
        if ((int)(uVar1 | uVar3 | uVar4) < 0) {
          __assert_fail("iVarA >= 0 && iVarB >= 0 && iVarC >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                        ,0x1a8,"int sat_solver_add_xor(sat_solver *, int, int, int, int)");
        }
        local_68.tv_sec._0_4_ = uVar3 * 2 + 1;
        local_68.tv_sec._4_4_ = uVar1 * 2 + 1;
        local_68.tv_nsec._0_4_ = uVar4 * 2 + 1;
        local_4c = (int)local_68.tv_nsec;
        local_48 = local_68.tv_sec._4_4_;
        local_44 = (int)local_68.tv_sec;
        iVar9 = sat_solver_addclause(local_58,(lit *)&local_68,plVar7);
        if (iVar9 == 0) {
          __assert_fail("Cid",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                        ,0x1ae,"int sat_solver_add_xor(sat_solver *, int, int, int, int)");
        }
        local_68.tv_sec._0_4_ = local_44;
        local_68.tv_sec._4_4_ = uVar1 * 2;
        local_68.tv_nsec._0_4_ = uVar4 * 2;
        iVar9 = sat_solver_addclause(local_58,(lit *)&local_68,plVar7);
        if (iVar9 == 0) {
          __assert_fail("Cid",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                        ,0x1b4,"int sat_solver_add_xor(sat_solver *, int, int, int, int)");
        }
        local_68.tv_sec._4_4_ = local_48;
        local_68.tv_sec._0_4_ = uVar3 * 2;
        local_68.tv_nsec._0_4_ = uVar4 * 2;
        iVar9 = sat_solver_addclause(local_58,(lit *)&local_68,plVar7);
        if (iVar9 == 0) {
          __assert_fail("Cid",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                        ,0x1ba,"int sat_solver_add_xor(sat_solver *, int, int, int, int)");
        }
        local_68.tv_nsec._0_4_ = local_4c;
        local_68.tv_sec._0_4_ = uVar3 * 2;
        local_68.tv_sec._4_4_ = uVar1 * 2;
        iVar9 = sat_solver_addclause(local_58,(lit *)&local_68,plVar7);
        if (iVar9 == 0) {
          __assert_fail("Cid",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                        ,0x1c0,"int sat_solver_add_xor(sat_solver *, int, int, int, int)");
        }
        if (p->nSatVars < 1) {
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        if (p->vLits->nSize <= local_38) {
LAB_00531e3c:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        p->vLits->pArray[local_38] = p->nSatVars * 2 + -2;
        lVar14 = local_38 + 1;
        pVVar11 = p->vRoots;
      } while (lVar14 < pVVar11->nSize);
    }
    plVar7 = p->vLits->pArray;
    iVar9 = sat_solver_addclause(p->pSat,plVar7,plVar7 + p->vLits->nSize);
    if (iVar9 == 0) {
      return 0;
    }
  }
  iVar9 = sat_solver_simplify(p->pSat);
  iVar10 = clock_gettime(3,&local_68);
  if (iVar10 < 0) {
    lVar14 = -1;
  }
  else {
    lVar14 = CONCAT44(local_68.tv_nsec._4_4_,(int)local_68.tv_nsec) / 1000 +
             CONCAT44(local_68.tv_sec._4_4_,(int)local_68.tv_sec) * 1000000;
  }
  p->timeCnf = p->timeCnf + lVar14 + local_40;
  return iVar9;
}

Assistant:

int Sfm_NtkWindowToSolver( Sfm_Ntk_t * p )
{
    // p->vOrder contains all variables in the window in a good order
    // p->vDivs is a subset of nodes in p->vOrder used as divisor candidates
    // p->vTfo contains TFO of the node (does not include node)
    // p->vRoots contains roots of the TFO of the node (may include node)
    Vec_Int_t * vClause;
    int RetValue, iNode = -1, iFanin, i, k;
    abctime clk = Abc_Clock();
//    if ( p->pSat )
//        printf( "%d  ", p->pSat->stats.learnts );
    sat_solver_restart( p->pSat );
    sat_solver_setnvars( p->pSat, 1 + Vec_IntSize(p->vOrder) + Vec_IntSize(p->vTfo) + Vec_IntSize(p->vRoots) + 10 );
    // create SAT variables
    Sfm_NtkCleanVars( p );
    p->nSatVars = 1;
    Vec_IntForEachEntry( p->vOrder, iNode, i )
        Sfm_ObjSetSatVar( p, iNode, p->nSatVars++ );
    // collect divisor variables
    Vec_IntClear( p->vDivVars );
    Vec_IntForEachEntry( p->vDivs, iNode, i )
        Vec_IntPush( p->vDivVars, Sfm_ObjSatVar(p, iNode) );
    // add CNF clauses for the TFI
    Vec_IntForEachEntry( p->vOrder, iNode, i )
    {
        if ( Sfm_ObjIsPi(p, iNode) )
            continue;
        // collect fanin variables
        Vec_IntClear( p->vFaninMap );
        Sfm_ObjForEachFanin( p, iNode, iFanin, k )
            Vec_IntPush( p->vFaninMap, Sfm_ObjSatVar(p, iFanin) );
        Vec_IntPush( p->vFaninMap, Sfm_ObjSatVar(p, iNode) );
        // generate CNF 
        Sfm_TranslateCnf( p->vClauses, (Vec_Str_t *)Vec_WecEntry(p->vCnfs, iNode), p->vFaninMap, -1 );
        // add clauses
        Vec_WecForEachLevel( p->vClauses, vClause, k )
        {
            if ( Vec_IntSize(vClause) == 0 )
                break;
            RetValue = sat_solver_addclause( p->pSat, Vec_IntArray(vClause), Vec_IntArray(vClause) + Vec_IntSize(vClause) );
            if ( RetValue == 0 )
                return 0;
        }
    }
    if ( Vec_IntSize(p->vTfo) > 0 )
    {
        assert( p->pPars->nTfoLevMax > 0 );
        assert( Vec_IntSize(p->vRoots) > 0 );
        assert( Vec_IntEntry(p->vTfo, 0) != p->iPivotNode );
        // collect variables of root nodes
        Vec_IntClear( p->vLits );
        Vec_IntForEachEntry( p->vRoots, iNode, i )
            Vec_IntPush( p->vLits, Sfm_ObjSatVar(p, iNode) );
        // assign new variables to the TFO nodes
        Vec_IntForEachEntry( p->vTfo, iNode, i )
        {
            Sfm_ObjCleanSatVar( p, Sfm_ObjSatVar(p, iNode) );
            Sfm_ObjSetSatVar( p, iNode, p->nSatVars++ );
        }
        // add CNF clauses for the TFO
        Vec_IntForEachEntry( p->vTfo, iNode, i )
        {
            assert( Sfm_ObjIsNode(p, iNode) );
            // collect fanin variables
            Vec_IntClear( p->vFaninMap );
            Sfm_ObjForEachFanin( p, iNode, iFanin, k )
                Vec_IntPush( p->vFaninMap, Sfm_ObjSatVar(p, iFanin) );
            Vec_IntPush( p->vFaninMap, Sfm_ObjSatVar(p, iNode) );
            // generate CNF 
            Sfm_TranslateCnf( p->vClauses, (Vec_Str_t *)Vec_WecEntry(p->vCnfs, iNode), p->vFaninMap, Sfm_ObjSatVar(p, p->iPivotNode) );
            // add clauses
            Vec_WecForEachLevel( p->vClauses, vClause, k )
            {
                if ( Vec_IntSize(vClause) == 0 )
                    break;
                RetValue = sat_solver_addclause( p->pSat, Vec_IntArray(vClause), Vec_IntArray(vClause) + Vec_IntSize(vClause) );
                if ( RetValue == 0 )
                    return 0;
            }
        }
        // create XOR clauses for the roots
        Vec_IntForEachEntry( p->vRoots, iNode, i )
        {
            sat_solver_add_xor( p->pSat, Vec_IntEntry(p->vLits, i), Sfm_ObjSatVar(p, iNode), p->nSatVars++, 0 );
            Vec_IntWriteEntry( p->vLits, i, Abc_Var2Lit(p->nSatVars-1, 0) );
        }
        // make OR clause for the last nRoots variables
        RetValue = sat_solver_addclause( p->pSat, Vec_IntArray(p->vLits), Vec_IntArray(p->vLits) + Vec_IntSize(p->vLits) );
        if ( RetValue == 0 )
            return 0;
    }
    // finalize
    RetValue = sat_solver_simplify( p->pSat );
    p->timeCnf += Abc_Clock() - clk;
    return RetValue;
}